

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::SqueezeLayerParams::InternalSwap
          (SqueezeLayerParams *this,SqueezeLayerParams *other)

{
  bool bVar1;
  int iVar2;
  
  google::protobuf::RepeatedField<long>::InternalSwap(&this->axes_,&other->axes_);
  bVar1 = this->squeezeall_;
  this->squeezeall_ = other->squeezeall_;
  other->squeezeall_ = bVar1;
  iVar2 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar2;
  return;
}

Assistant:

void SqueezeLayerParams::InternalSwap(SqueezeLayerParams* other) {
  axes_.InternalSwap(&other->axes_);
  std::swap(squeezeall_, other->squeezeall_);
  std::swap(_cached_size_, other->_cached_size_);
}